

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type * __thiscall
FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_>::val
          (FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_> *this)

{
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *in_RSI;
  value_type *in_RDI;
  Fad<double> *unaff_retaddr;
  Fad<double> *in_stack_ffffffffffffffe0;
  Fad<double> *in_stack_ffffffffffffffe8;
  value_type *fadexpr;
  
  fadexpr = in_RDI;
  Fad<Fad<double>_>::val((Fad<Fad<double>_> *)(in_RSI->fadexpr_).left_);
  Fad<Fad<double>_>::val((Fad<Fad<double>_> *)(in_RSI->fadexpr_).right_);
  operator+<Fad<double>,_Fad<double>,_nullptr>(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  Fad<double>::Fad<FadBinaryAdd<Fad<double>,Fad<double>>>
            (unaff_retaddr,(FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)fadexpr);
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr(in_RSI);
  return in_RDI;
}

Assistant:

const value_type val() const {return left_.val() + right_.val();}